

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

Matrix<double> __thiscall Matrix<double>::Inverse(Matrix<double> *this)

{
  int a;
  double *pdVar1;
  double **ppdVar2;
  bool bVar3;
  uint uVar4;
  Matrix<double> *pMVar5;
  ulong uVar6;
  double **extraout_RDX;
  int iVar7;
  int *in_RSI;
  ulong uVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int j;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  int k;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  Matrix<double> MVar22;
  Matrix<double> A;
  Matrix<double> *Inv;
  Matrix<double> local_50;
  int *local_40;
  Matrix<double> *local_38;
  
  local_38 = this;
  Matrix(&local_50,*in_RSI,*in_RSI * 2);
  pMVar5 = local_38;
  a = *in_RSI;
  uVar6 = (ulong)a;
  if (0 < (long)uVar6) {
    lVar9 = *(long *)(in_RSI + 2);
    uVar8 = 0;
    do {
      lVar10 = *(long *)(lVar9 + uVar8 * 8);
      pdVar16 = local_50.M[uVar8];
      uVar13 = 0;
      do {
        pdVar16[uVar13] = *(double *)(lVar10 + uVar13 * 8);
        uVar13 = uVar13 + 1;
      } while (uVar6 != uVar13);
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
    if (0 < a) {
      lVar9 = 0;
      do {
        *(undefined8 *)(lVar9 + *(long *)((long)local_50.M + lVar9) + uVar6 * 8) =
             0x3ff0000000000000;
        lVar9 = lVar9 + 8;
      } while (uVar6 * 8 - lVar9 != 0);
      if (0 < a) {
        uVar4 = a * 2;
        uVar12 = 1;
        lVar9 = 0;
        uVar8 = (ulong)uVar4;
        uVar13 = 0;
        do {
          pdVar16 = local_50.M[uVar13];
          uVar14 = uVar13 + 1;
          if (uVar14 < uVar6) {
            dVar20 = ABS(pdVar16[uVar13]);
            uVar18 = uVar13 & 0xffffffff;
            uVar17 = uVar12;
            do {
              dVar21 = ABS(local_50.M[uVar17][uVar13]);
              uVar19 = -(ulong)(dVar20 < dVar21);
              if (dVar20 < dVar21) {
                uVar18 = uVar17 & 0xffffffff;
              }
              iVar7 = (int)uVar18;
              dVar20 = (double)(~uVar19 & (ulong)dVar20 | (ulong)local_50.M[uVar17][uVar13] & uVar19
                               );
              uVar17 = uVar17 + 1;
            } while (uVar6 != uVar17);
          }
          else {
            iVar7 = (int)uVar13;
          }
          pdVar1 = local_50.M[iVar7];
          uVar17 = uVar13;
          do {
            dVar20 = pdVar1[uVar17];
            pdVar1[uVar17] = pdVar16[uVar17];
            pdVar16[uVar17] = dVar20;
            uVar17 = uVar17 + 1;
          } while (uVar4 != uVar17);
          uVar17 = uVar12;
          if (uVar14 < uVar6) {
            do {
              pdVar1 = local_50.M[uVar17];
              dVar20 = pdVar1[uVar13];
              dVar21 = pdVar16[uVar13];
              uVar18 = 0;
              do {
                if (uVar18 == 0) {
                  pdVar1[uVar13] = 0.0;
                }
                else {
                  *(double *)((long)pdVar1 + uVar18 * 8 + lVar9) =
                       *(double *)((long)pdVar16 + uVar18 * 8 + lVar9) * (-dVar20 / dVar21) +
                       *(double *)((long)pdVar1 + uVar18 * 8 + lVar9);
                }
                uVar18 = uVar18 + 1;
              } while (uVar8 != uVar18);
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar6);
          }
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 8;
          uVar8 = uVar8 - 1;
          uVar13 = uVar14;
        } while (uVar14 != uVar6);
        if (0 < a) {
          uVar11 = a - 2;
          uVar8 = uVar6;
          do {
            uVar13 = uVar8 - 1;
            pdVar1 = local_50.M[uVar8 - 1];
            pdVar16 = pdVar1 + uVar6;
            iVar7 = a;
            do {
              *pdVar16 = *pdVar16 / pdVar1[uVar13];
              pdVar16 = pdVar16 + 1;
              iVar7 = iVar7 + 1;
            } while (iVar7 < (int)uVar4);
            if ((long)uVar8 < 2) break;
            pdVar16 = local_50.M[uVar13];
            uVar12 = (ulong)uVar11;
            do {
              pdVar1 = local_50.M[uVar12];
              lVar9 = 0;
              do {
                pdVar1[uVar6 + lVar9] =
                     pdVar1[uVar6 + lVar9] - pdVar16[uVar6 + lVar9] * pdVar1[uVar13];
                lVar9 = lVar9 + 1;
              } while ((int)lVar9 + a < (int)uVar4);
              iVar7 = (int)uVar12;
              uVar12 = uVar12 - 1;
            } while (0 < iVar7);
            uVar11 = uVar11 - 1;
            bVar3 = 1 < (long)uVar8;
            uVar8 = uVar13;
          } while (bVar3);
        }
      }
    }
  }
  local_40 = in_RSI;
  Matrix(local_38,a,a);
  lVar9 = (long)*local_40;
  if (0 < lVar9) {
    ppdVar2 = pMVar5->M;
    lVar10 = 0;
    do {
      pdVar16 = ppdVar2[lVar10];
      pdVar1 = local_50.M[lVar10];
      lVar15 = 0;
      do {
        pdVar16[lVar15] = pdVar1[lVar9 + lVar15];
        lVar15 = lVar15 + 1;
      } while (lVar9 != lVar15);
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
  }
  ~Matrix(&local_50);
  MVar22.M = extraout_RDX;
  MVar22._0_8_ = pMVar5;
  return MVar22;
}

Assistant:

Matrix Inverse() const {
    Matrix<T> A(n, 2 * n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        A.M[i][j] = M[i][j];
      }
    }
    for (int i = 0; i < n; i++) {
      A.M[i][n + i] = 1;
    }

    for (int i = 0; i < n; i++) {
      double maxEl = abs(A.M[i][i]);
      int maxRow = i;
      for (int k = i + 1; k < n; k++) {
        if (abs(A.M[k][i]) > maxEl) {
          maxEl = A.M[k][i];
          maxRow = k;
        }
      }

      for (int k = i; k < 2 * n; k++) {
        double tmp = A.M[maxRow][k];
        A.M[maxRow][k] = A.M[i][k];
        A.M[i][k] = tmp;
      }

      for (int k = i + 1; k < n; k++) {
        double c = -A.M[k][i] / A.M[i][i];
        for (int j = i; j < 2 * n; j++) {
          if (i == j) {
            A.M[k][j] = 0;
          } else {
            A.M[k][j] += c * A.M[i][j];
          }
        }
      }
    }

    for (int i = n - 1; i >= 0; i--) {
      for (int k = n; k < 2 * n; k++) {
        A.M[i][k] /= A.M[i][i];
      }
      for (int rowMod = i - 1; rowMod >= 0; rowMod--) {
        for (int columMod = n; columMod < 2 * n; columMod++) {
          A.M[rowMod][columMod] -= A.M[i][columMod] * A.M[rowMod][i];
        }
      }
    }

    Matrix<T> Inv(n, n);
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < n; j++) {
        Inv.M[i][j] = A.M[i][j + n];
      }
    }
    return Inv;
  }